

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<int,_1000>::Resize(TPZManVector<int,_1000> *this,int64_t newsize,int *object)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ostream *poVar4;
  int *piVar5;
  ulong uVar6;
  int64_t i;
  long lVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<int>).fNElements;
    if (lVar7 != newsize) {
      lVar3 = (this->super_TPZVec<int>).fNAlloc;
      if (lVar3 < newsize) {
        if ((ulong)newsize < 0x3e9) {
          piVar5 = (this->super_TPZVec<int>).fStore;
          piVar2 = this->fExtAlloc;
          lVar3 = 0;
          if (lVar7 < 1) {
            lVar7 = lVar3;
          }
          for (; lVar7 != lVar3; lVar3 = lVar3 + 1) {
            piVar2[lVar3] = piVar5[lVar3];
          }
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            piVar2[lVar7] = *object;
          }
          if (piVar5 != (int *)0x0 && piVar5 != piVar2) {
            operator_delete__(piVar5);
          }
          (this->super_TPZVec<int>).fStore = piVar2;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = 1000;
        }
        else {
          dVar8 = (double)lVar3 * 1.2;
          uVar6 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar6 = newsize;
          }
          lVar3 = 0;
          piVar5 = (int *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
          piVar2 = (this->super_TPZVec<int>).fStore;
          if (lVar7 < 1) {
            lVar7 = lVar3;
          }
          for (; lVar7 != lVar3; lVar3 = lVar3 + 1) {
            piVar5[lVar3] = piVar2[lVar3];
          }
          iVar1 = *object;
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            piVar5[lVar7] = iVar1;
          }
          if (piVar2 != (int *)0x0 && piVar2 != this->fExtAlloc) {
            operator_delete__(piVar2);
          }
          (this->super_TPZVec<int>).fStore = piVar5;
          (this->super_TPZVec<int>).fNElements = newsize;
          (this->super_TPZVec<int>).fNAlloc = uVar6;
        }
      }
      else {
        piVar2 = (this->super_TPZVec<int>).fStore;
        for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
          piVar2[lVar7] = *object;
        }
        (this->super_TPZVec<int>).fNElements = newsize;
      }
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}